

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

int __thiscall Map_Chest::DelItem(Map_Chest *this,short item_id)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  p_Var4 = (_List_node_base *)&this->items;
  do {
    p_Var4 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var4->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->items) {
      return 0;
    }
  } while (*(short *)&p_Var4[1]._M_next != item_id);
  iVar2 = *(int *)((long)&p_Var4[1]._M_next + 4);
  if (*(int *)&p_Var4[1]._M_prev != 0) {
    p_Var5 = (_List_node_base *)Timer::GetTime();
    for (p_Var3 = (this->spawns).super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)&this->spawns; p_Var3 = p_Var3->_M_next) {
      if (*(int *)&p_Var3[2]._M_next == *(int *)&p_Var4[1]._M_prev) {
        p_Var3[2]._M_prev = p_Var5;
      }
    }
  }
  psVar1 = &(this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var4,0x20);
  return iVar2;
}

Assistant:

int Map_Chest::DelItem(short item_id)
{
	UTIL_IFOREACH(this->items, it)
	{
		if (it->id == item_id)
		{
			int amount = it->amount;

			if (it->slot)
			{
				double current_time = Timer::GetTime();

				UTIL_FOREACH_REF(this->spawns, spawn)
				{
					if (spawn.slot == it->slot)
					{
						spawn.last_taken = current_time;
					}
				}
			}

			this->items.erase(it);
			return amount;
		}
	}

	return 0;
}